

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessInitialize(cmsysProcess *cp)

{
  pid_t *ppVar1;
  int *piVar2;
  char *pcVar3;
  fd_set *__arr;
  uint __i;
  int i;
  cmsysProcess *cp_local;
  
  for (__arr._4_4_ = 0; __arr._4_4_ < 3; __arr._4_4_ = __arr._4_4_ + 1) {
    cp->PipeReadEnds[__arr._4_4_] = -1;
  }
  for (__arr._4_4_ = 0; __arr._4_4_ < 3; __arr._4_4_ = __arr._4_4_ + 1) {
    cp->PipeChildStd[__arr._4_4_] = -1;
  }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  (cp->StartTime).tv_sec = -1;
  (cp->StartTime).tv_usec = -1;
  (cp->TimeoutTime).tv_sec = -1;
  (cp->TimeoutTime).tv_usec = -1;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (cp->PipeSet).__fds_bits[(uint)__arr] = 0;
  }
  cp->State = 0;
  cp->Killed = 0;
  cp->ExitException = 0;
  cp->ExitCode = 1;
  cp->ExitValue = 1;
  cp->ErrorMessage[0] = '\0';
  strcpy(cp->ExitExceptionString,"No exception");
  if (cp->ForkPIDs != (pid_t *)0x0) {
    free(cp->ForkPIDs);
  }
  ppVar1 = (pid_t *)malloc((long)cp->NumberOfCommands << 2);
  cp->ForkPIDs = ppVar1;
  if (cp->ForkPIDs == (pid_t *)0x0) {
    cp_local._4_4_ = 0;
  }
  else {
    memset(cp->ForkPIDs,0,(long)cp->NumberOfCommands << 2);
    if (cp->CommandExitCodes != (int *)0x0) {
      free(cp->CommandExitCodes);
    }
    piVar2 = (int *)malloc((long)cp->NumberOfCommands << 2);
    cp->CommandExitCodes = piVar2;
    if (cp->CommandExitCodes == (int *)0x0) {
      cp_local._4_4_ = 0;
    }
    else {
      memset(cp->CommandExitCodes,0,(long)cp->NumberOfCommands << 2);
      if (cp->WorkingDirectory != (char *)0x0) {
        cp->RealWorkingDirectoryLength = 0x1000;
        pcVar3 = (char *)malloc((long)cp->RealWorkingDirectoryLength);
        cp->RealWorkingDirectory = pcVar3;
        if (cp->RealWorkingDirectory == (char *)0x0) {
          return 0;
        }
      }
      cp_local._4_4_ = 1;
    }
  }
  return cp_local._4_4_;
}

Assistant:

static int kwsysProcessInitialize(kwsysProcess* cp)
{
  int i;
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    cp->PipeReadEnds[i] = -1;
    }
  for(i=0; i < 3; ++i)
    {
    cp->PipeChildStd[i] = -1;
    }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  cp->StartTime.tv_sec = -1;
  cp->StartTime.tv_usec = -1;
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
#if KWSYSPE_USE_SELECT
  FD_ZERO(&cp->PipeSet);
#endif
  cp->State = kwsysProcess_State_Starting;
  cp->Killed = 0;
  cp->ExitException = kwsysProcess_Exception_None;
  cp->ExitCode = 1;
  cp->ExitValue = 1;
  cp->ErrorMessage[0] = 0;
  strcpy(cp->ExitExceptionString, "No exception");

  if(cp->ForkPIDs)
    {
    free(cp->ForkPIDs);
    }
  cp->ForkPIDs = (pid_t*)malloc(sizeof(pid_t)*(size_t)(cp->NumberOfCommands));
  if(!cp->ForkPIDs)
    {
    return 0;
    }
  memset(cp->ForkPIDs, 0, sizeof(pid_t)*(size_t)(cp->NumberOfCommands));

  if(cp->CommandExitCodes)
    {
    free(cp->CommandExitCodes);
    }
  cp->CommandExitCodes = (int*)malloc(sizeof(int)*
                                      (size_t)(cp->NumberOfCommands));
  if(!cp->CommandExitCodes)
    {
    return 0;
    }
  memset(cp->CommandExitCodes, 0, sizeof(int)*(size_t)(cp->NumberOfCommands));

  /* Allocate memory to save the real working directory.  */
  if ( cp->WorkingDirectory )
    {
#if defined(MAXPATHLEN)
    cp->RealWorkingDirectoryLength = MAXPATHLEN;
#elif defined(PATH_MAX)
    cp->RealWorkingDirectoryLength = PATH_MAX;
#else
    cp->RealWorkingDirectoryLength = 4096;
#endif
    cp->RealWorkingDirectory =
      (char*)malloc((size_t)(cp->RealWorkingDirectoryLength));
    if(!cp->RealWorkingDirectory)
      {
      return 0;
      }
    }

  return 1;
}